

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterhash.h
# Opt level: O3

void __thiscall
CharacterHash<unsigned_long_long,_unsigned_char>::CharacterHash
          (CharacterHash<unsigned_long_long,_unsigned_char> *this,unsigned_long_long maxval)

{
  uint32 uVar1;
  uint32 uVar2;
  unsigned_long_long uVar3;
  size_t k;
  long lVar4;
  mersenneRNG randomgeneratorbase;
  mersenneRNG randomgenerator;
  uint32 local_2768;
  MTRand local_2760;
  int local_13d0;
  MTRand local_13c8;
  int local_38;
  
  MTRand::seed(&local_13c8);
  local_38 = (int)(maxval >> 0x20);
  uVar3 = 0xffffffff;
  if (maxval < 0xffffffff) {
    uVar3 = maxval;
  }
  MTRand::seed(&local_2760);
  local_13d0 = (int)uVar3;
  lVar4 = 0;
  do {
    local_2768 = (uint32)local_13d0;
    uVar1 = MTRand::randInt(&local_2760,&local_2768);
    local_2768 = (uint32)local_38;
    uVar2 = MTRand::randInt(&local_13c8,&local_2768);
    this->hashvalues[lVar4] = uVar2 << 0x20 | uVar1 & 0xffffffff;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  return;
}

Assistant:

CharacterHash(hashvaluetype maxval) {
    if (sizeof(hashvaluetype) <= 4) {
      mersenneRNG randomgenerator(maxval);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgenerator());
    } else if (sizeof(hashvaluetype) == 8) {
      mersenneRNG randomgenerator(maxval >> 32);
      mersenneRNG randomgeneratorbase((maxval >> 32) == 0 ? maxval
                                                          : 0xFFFFFFFFU);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgeneratorbase()) |
                        (static_cast<hashvaluetype>(randomgenerator()) << 32);
    } else
      throw runtime_error("unsupported hash value type");
  }